

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderNodeType(xmlTextReaderPtr reader)

{
  int iVar1;
  xmlNodePtr local_20;
  xmlNodePtr node;
  xmlTextReaderPtr reader_local;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    reader_local._4_4_ = -1;
  }
  else if (reader->node == (xmlNodePtr)0x0) {
    reader_local._4_4_ = 0;
  }
  else {
    if (reader->curnode == (xmlNodePtr)0x0) {
      local_20 = reader->node;
    }
    else {
      local_20 = reader->curnode;
    }
    switch(local_20->type) {
    case XML_ELEMENT_NODE:
      if ((reader->state == XML_TEXTREADER_END) || (reader->state == XML_TEXTREADER_BACKTRACK)) {
        reader_local._4_4_ = 0xf;
      }
      else {
        reader_local._4_4_ = 1;
      }
      break;
    case XML_ATTRIBUTE_NODE:
    case XML_NAMESPACE_DECL:
      reader_local._4_4_ = 2;
      break;
    case XML_TEXT_NODE:
      iVar1 = xmlIsBlankNode(reader->node);
      if (iVar1 == 0) {
        reader_local._4_4_ = 3;
      }
      else {
        iVar1 = xmlNodeGetSpacePreserve(reader->node);
        if (iVar1 == 0) {
          reader_local._4_4_ = 0xd;
        }
        else {
          reader_local._4_4_ = 0xe;
        }
      }
      break;
    case XML_CDATA_SECTION_NODE:
      reader_local._4_4_ = 4;
      break;
    case XML_ENTITY_REF_NODE:
      reader_local._4_4_ = 5;
      break;
    case XML_ENTITY_NODE:
      reader_local._4_4_ = 6;
      break;
    case XML_PI_NODE:
      reader_local._4_4_ = 7;
      break;
    case XML_COMMENT_NODE:
      reader_local._4_4_ = 8;
      break;
    case XML_DOCUMENT_NODE:
    case XML_HTML_DOCUMENT_NODE:
    case XML_DOCB_DOCUMENT_NODE:
      reader_local._4_4_ = 9;
      break;
    case XML_DOCUMENT_TYPE_NODE:
    case XML_DTD_NODE:
      reader_local._4_4_ = 10;
      break;
    case XML_DOCUMENT_FRAG_NODE:
      reader_local._4_4_ = 0xb;
      break;
    case XML_NOTATION_NODE:
      reader_local._4_4_ = 0xc;
      break;
    case XML_ELEMENT_DECL:
    case XML_ATTRIBUTE_DECL:
    case XML_ENTITY_DECL:
    case XML_XINCLUDE_START:
    case XML_XINCLUDE_END:
      reader_local._4_4_ = 0;
      break;
    default:
      reader_local._4_4_ = -1;
    }
  }
  return reader_local._4_4_;
}

Assistant:

int
xmlTextReaderNodeType(xmlTextReaderPtr reader) {
    xmlNodePtr node;

    if (reader == NULL)
	return(-1);
    if (reader->node == NULL)
	return(XML_READER_TYPE_NONE);
    if (reader->curnode != NULL)
	node = reader->curnode;
    else
	node = reader->node;
    switch (node->type) {
        case XML_ELEMENT_NODE:
	    if ((reader->state == XML_TEXTREADER_END) ||
		(reader->state == XML_TEXTREADER_BACKTRACK))
		return(XML_READER_TYPE_END_ELEMENT);
	    return(XML_READER_TYPE_ELEMENT);
        case XML_NAMESPACE_DECL:
        case XML_ATTRIBUTE_NODE:
	    return(XML_READER_TYPE_ATTRIBUTE);
        case XML_TEXT_NODE:
	    if (xmlIsBlankNode(reader->node)) {
		if (xmlNodeGetSpacePreserve(reader->node))
		    return(XML_READER_TYPE_SIGNIFICANT_WHITESPACE);
		else
		    return(XML_READER_TYPE_WHITESPACE);
	    } else {
		return(XML_READER_TYPE_TEXT);
	    }
        case XML_CDATA_SECTION_NODE:
	    return(XML_READER_TYPE_CDATA);
        case XML_ENTITY_REF_NODE:
	    return(XML_READER_TYPE_ENTITY_REFERENCE);
        case XML_ENTITY_NODE:
	    return(XML_READER_TYPE_ENTITY);
        case XML_PI_NODE:
	    return(XML_READER_TYPE_PROCESSING_INSTRUCTION);
        case XML_COMMENT_NODE:
	    return(XML_READER_TYPE_COMMENT);
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
#ifdef LIBXML_DOCB_ENABLED
        case XML_DOCB_DOCUMENT_NODE:
#endif
	    return(XML_READER_TYPE_DOCUMENT);
        case XML_DOCUMENT_FRAG_NODE:
	    return(XML_READER_TYPE_DOCUMENT_FRAGMENT);
        case XML_NOTATION_NODE:
	    return(XML_READER_TYPE_NOTATION);
        case XML_DOCUMENT_TYPE_NODE:
        case XML_DTD_NODE:
	    return(XML_READER_TYPE_DOCUMENT_TYPE);

        case XML_ELEMENT_DECL:
        case XML_ATTRIBUTE_DECL:
        case XML_ENTITY_DECL:
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
	    return(XML_READER_TYPE_NONE);
    }
    return(-1);
}